

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactTuple.h
# Opt level: O1

void __thiscall
chrono::ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>::
ChContactTuple(ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_> *this
              ,ChContactContainer *mcontainer,ChContactable_1vars<6> *mobjA,
              ChContactable_1vars<3> *mobjB,ChCollisionInfo *cinfo)

{
  this->_vptr_ChContactTuple = (_func_int **)&PTR__ChContactTuple_00b3a890;
  (this->p1).m_data[0] = 0.0;
  (this->p1).m_data[1] = 0.0;
  (this->p1).m_data[2] = 0.0;
  (this->p2).m_data[0] = 0.0;
  (this->p2).m_data[1] = 0.0;
  (this->p2).m_data[2] = 0.0;
  (this->normal).m_data[0] = 0.0;
  (this->normal).m_data[1] = 0.0;
  (this->normal).m_data[2] = 0.0;
  if (mcontainer == (ChContactContainer *)0x0) {
    __assert_fail("mcontainer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x3e,
                  "chrono::ChContactTuple<chrono::ChContactable_1vars<6>, chrono::ChContactable_1vars<3>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_1vars<6>, Tb = chrono::ChContactable_1vars<3>]"
                 );
  }
  if (mobjA != (ChContactable_1vars<6> *)0x0) {
    if (mobjB != (ChContactable_1vars<3> *)0x0) {
      this->container = mcontainer;
      return;
    }
    __assert_fail("mobjB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x40,
                  "chrono::ChContactTuple<chrono::ChContactable_1vars<6>, chrono::ChContactable_1vars<3>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_1vars<6>, Tb = chrono::ChContactable_1vars<3>]"
                 );
  }
  __assert_fail("mobjA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                ,0x3f,
                "chrono::ChContactTuple<chrono::ChContactable_1vars<6>, chrono::ChContactable_1vars<3>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_1vars<6>, Tb = chrono::ChContactable_1vars<3>]"
               );
}

Assistant:

ChContactTuple(ChContactContainer* mcontainer,          ///< contact container
                   Ta* mobjA,                               ///< ChContactable object A
                   Tb* mobjB,                               ///< ChContactable object B
                   const collision::ChCollisionInfo& cinfo  ///< data for the contact pair
    ) {
        assert(mcontainer);
        assert(mobjA);
        assert(mobjB);

        container = mcontainer;
    }